

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

bool __thiscall reflection::Object::Verify(Object *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  String *pSVar3;
  Object *pOVar4;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec_00;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_01;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      pSVar3 = (String *)0x0;
    }
    else {
      pSVar3 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar3);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      if (*(ushort *)(this + -(long)*(int *)this) < 7) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (6 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        pOVar4 = (Object *)0x0;
      }
      else {
        pOVar4 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
      }
      if ((pOVar4 != (Object *)0x0) &&
         (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)pOVar4,4,(size_t *)0x0), !bVar1)) {
        return false;
      }
      if (*(ushort *)(this + -(long)*(int *)this) < 7) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (6 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        vec = (Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)0x0;
      }
      else {
        vec = (Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)
              (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Field>
                        (verifier,vec);
      if (bVar1) {
        if (*(ushort *)(this + -(long)*(int *)this) < 9) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ushort *)(this + (8 - (long)*(int *)this));
        }
        if (uVar2 != 0) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Object *)(verifier->size_ - 1) < this + ((ulong)uVar2 - (long)verifier->buf_)) {
            return false;
          }
        }
        bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,10,4);
        if (((bVar1) &&
            (bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,0xc,4), bVar1)
            ) && (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                    (&this->super_Table,verifier,0xe), bVar1)) {
          if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            pOVar4 = (Object *)0x0;
          }
          else {
            pOVar4 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
          }
          if ((pOVar4 != (Object *)0x0) &&
             (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (verifier,(uint8_t *)pOVar4,4,(size_t *)0x0), !bVar1)) {
            return false;
          }
          if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
          }
          else {
            vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                     (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                            (verifier,vec_00);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0x10), bVar1)) {
            if (*(ushort *)(this + -(long)*(int *)this) < 0x11) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0x10 - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              pOVar4 = (Object *)0x0;
            }
            else {
              pOVar4 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
            }
            if ((pOVar4 != (Object *)0x0) &&
               (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                  (verifier,(uint8_t *)pOVar4,4,(size_t *)0x0), !bVar1)) {
              return false;
            }
            if (*(ushort *)(this + -(long)*(int *)this) < 0x11) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0x10 - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
            }
            else {
              vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                       (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec_01);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0x12), bVar1)) {
              if (*(ushort *)(this + -(long)*(int *)this) < 0x13) {
                uVar2 = 0;
              }
              else {
                uVar2 = *(ushort *)(this + (0x12 - (long)*(int *)this));
              }
              if (uVar2 == 0) {
                pSVar3 = (String *)0x0;
              }
              else {
                pSVar3 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
              }
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar3);
              if (bVar1) {
                verifier->depth_ = verifier->depth_ - 1;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_FIELDS) &&
           verifier.VerifyVector(fields()) &&
           verifier.VerifyVectorOfTables(fields()) &&
           VerifyField<uint8_t>(verifier, VT_IS_STRUCT, 1) &&
           VerifyField<int32_t>(verifier, VT_MINALIGN, 4) &&
           VerifyField<int32_t>(verifier, VT_BYTESIZE, 4) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_DECLARATION_FILE) &&
           verifier.VerifyString(declaration_file()) &&
           verifier.EndTable();
  }